

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SliceStaticLayerParams::MergePartialFromCodedStream
          (SliceStaticLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  RepeatedField<long> *pRVar6;
  RepeatedField<bool> *pRVar7;
  char cVar8;
  ulong uVar9;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bf586;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bf586:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar9 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar4 | uVar9;
    }
    uVar4 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_003bf5ea_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 == '\b') {
        uVar4 = 10;
        pRVar6 = &this->beginids_;
LAB_003bf6eb:
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,uVar4,input,pRVar6);
      }
      else {
        pRVar6 = &this->beginids_;
        if ((uVar4 & 0xff) != 10) break;
LAB_003bf643:
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,pRVar6);
      }
      goto LAB_003bf5c6;
    case 2:
      if (cVar8 != '\x10') {
        pRVar7 = &this->beginmasks_;
        if ((uVar4 & 0xff) == 0x12) {
LAB_003bf6a5:
          bVar3 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (input,pRVar7);
          goto LAB_003bf5c6;
        }
        break;
      }
      uVar4 = 0x12;
      pRVar7 = &this->beginmasks_;
LAB_003bf712:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (1,uVar4,input,pRVar7);
      goto LAB_003bf5c6;
    case 3:
      if (cVar8 == '\x18') {
        uVar4 = 0x1a;
        pRVar6 = &this->endids_;
        goto LAB_003bf6eb;
      }
      pRVar6 = &this->endids_;
      if ((uVar4 & 0xff) == 0x1a) goto LAB_003bf643;
      break;
    case 4:
      if (cVar8 == ' ') {
        uVar4 = 0x22;
        pRVar7 = &this->endmasks_;
        goto LAB_003bf712;
      }
      pRVar7 = &this->endmasks_;
      if ((uVar4 & 0xff) == 0x22) goto LAB_003bf6a5;
      break;
    case 5:
      if (cVar8 == '(') {
        uVar4 = 0x2a;
        pRVar6 = &this->strides_;
        goto LAB_003bf6eb;
      }
      pRVar6 = &this->strides_;
      if ((uVar4 & 0xff) == 0x2a) goto LAB_003bf643;
      break;
    case 6:
      if (cVar8 == '0') {
        uVar4 = 0x32;
        pRVar7 = &this->squeezemasks_;
        goto LAB_003bf712;
      }
      pRVar7 = &this->squeezemasks_;
      if ((uVar4 & 0xff) == 0x32) goto LAB_003bf6a5;
    }
switchD_003bf5ea_default:
    iVar5 = 7;
    if ((uVar4 & 7) != 4 && uVar4 != 0) {
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_003bf5c6:
      iVar5 = 6;
      if (bVar3 != false) {
        iVar5 = 0;
      }
    }
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool SliceStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SliceStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 beginIds = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_beginids())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_beginids())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool beginMasks = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_beginmasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 18u, input, this->mutable_beginmasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int64 endIds = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_endids())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(24u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 26u, input, this->mutable_endids())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool endMasks = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_endmasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 34u, input, this->mutable_endmasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int64 strides = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_strides())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(40u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 42u, input, this->mutable_strides())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool squeezeMasks = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_squeezemasks())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(48u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 50u, input, this->mutable_squeezemasks())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SliceStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SliceStaticLayerParams)
  return false;
#undef DO_
}